

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverAPGD.cpp
# Opt level: O1

void __thiscall
chrono::ChSolverAPGD::ShurBvectorCompute(ChSolverAPGD *this,ChSystemDescriptor *sysd)

{
  ChVariables *this_00;
  double *pdVar1;
  double *pdVar2;
  bool bVar3;
  Index size;
  pointer ppCVar4;
  pointer ppCVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  undefined1 auVar11 [64];
  double in_XMM0_Qa;
  long local_88;
  long lStack_80;
  long local_70;
  undefined8 uStack_68;
  ChVectorRef local_60;
  ChVectorRef local_48;
  
  ppCVar4 = (sysd->vvariables).
            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((sysd->vvariables).
      super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppCVar4) {
    uVar9 = 1;
    uVar6 = 0;
    do {
      this_00 = ppCVar4[uVar6];
      if (this_00->disabled == false) {
        ChVariables::Get_qb(&local_48,this_00);
        ChVariables::Get_fb(&local_60,
                            (sysd->vvariables).
                            super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar6]);
        in_XMM0_Qa = 0.0;
        local_70 = 0;
        uStack_68 = 0;
        local_88 = local_60.
                   super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                   ._0_8_;
        lStack_80 = local_60.
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ._8_8_;
        if ((long)local_60.
                  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                  ._8_8_ < 0 &&
            local_60.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ._0_8_ != 0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                       );
        }
        (*this_00->_vptr_ChVariables[4])(this_00,&local_48,&local_88);
        if (local_70 != 0) {
          free(*(void **)(local_70 + -8));
        }
      }
      uVar6 = (ulong)uVar9;
      ppCVar4 = (sysd->vvariables).
                super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar9 = uVar9 + 1;
    } while (uVar6 < (ulong)((long)(sysd->vvariables).
                                   super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3))
    ;
  }
  lVar8 = (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  if (-1 < lVar8) {
    if (lVar8 != 0) {
      memset((this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data,0,lVar8 << 3);
    }
    ppCVar5 = (sysd->vconstraints).
              super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((sysd->vconstraints).
        super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppCVar5) {
      iVar10 = 0;
      uVar6 = 0;
      uVar7 = 1;
      do {
        if (ppCVar5[uVar6]->active == true) {
          (*ppCVar5[uVar6]->_vptr_ChConstraint[7])();
          if ((iVar10 < 0) ||
             ((this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows <= (long)iVar10)) {
            __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                          "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [iVar10] = in_XMM0_Qa;
          iVar10 = iVar10 + 1;
        }
        ppCVar5 = (sysd->vconstraints).
                  super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar7 < (ulong)((long)(sysd->vconstraints).
                                      super__Vector_base<chrono::ChConstraint_*,_std::allocator<chrono::ChConstraint_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar5 >>
                               3);
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar3);
    }
    (*sysd->_vptr_ChSystemDescriptor[0xd])(sysd,&this->tmp);
    uVar6 = (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows;
    if (uVar6 == (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_rows) {
      pdVar1 = (this->tmp).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      pdVar2 = (this->r).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data;
      uVar7 = uVar6 + 7;
      if (-1 < (long)uVar6) {
        uVar7 = uVar6;
      }
      uVar7 = uVar7 & 0xfffffffffffffff8;
      if (7 < (long)uVar6) {
        lVar8 = 0;
        do {
          auVar11 = vaddpd_avx512f(*(undefined1 (*) [64])(pdVar1 + lVar8),
                                   *(undefined1 (*) [64])(pdVar2 + lVar8));
          *(undefined1 (*) [64])(pdVar2 + lVar8) = auVar11;
          lVar8 = lVar8 + 8;
        } while (lVar8 < (long)uVar7);
      }
      if ((long)uVar7 < (long)uVar6) {
        do {
          pdVar2[uVar7] = pdVar1[uVar7] + pdVar2[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar6 != uVar7);
      }
      return;
    }
    __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                  "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                  "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
                 );
  }
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

void ChSolverAPGD::ShurBvectorCompute(ChSystemDescriptor& sysd) {
    // ***TO DO*** move the following thirty lines in a short function ChSystemDescriptor::ShurBvectorCompute() ?

    // Compute the b_shur vector in the Shur complement equation N*l = b_shur
    // with
    //   N_shur  = D'* (M^-1) * D
    //   b_shur  = - c + D'*(M^-1)*k = b_i + D'*(M^-1)*k
    // but flipping the sign of lambdas,  b_shur = - b_i - D'*(M^-1)*k
    // Do this in three steps:

    // Put (M^-1)*k    in  q  sparse vector of each variable..
    for (unsigned int iv = 0; iv < sysd.GetVariablesList().size(); iv++)
        if (sysd.GetVariablesList()[iv]->IsActive())
            sysd.GetVariablesList()[iv]->Compute_invMb_v(sysd.GetVariablesList()[iv]->Get_qb(),
                                                         sysd.GetVariablesList()[iv]->Get_fb());  // q = [M]'*fb

    // ...and now do  b_shur = - D'*q = - D'*(M^-1)*k ..
    r.setZero();
    int s_i = 0;
    for (unsigned int ic = 0; ic < sysd.GetConstraintsList().size(); ic++)
        if (sysd.GetConstraintsList()[ic]->IsActive()) {
            r(s_i, 0) = sysd.GetConstraintsList()[ic]->Compute_Cq_q();
            ++s_i;
        }

    // ..and finally do   b_shur = b_shur - c
    sysd.BuildBiVector(tmp);  // b_i   =   -c   = phi/h
    r += tmp;
}